

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O1

double Glucose::memUsedPeak(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  double dVar4;
  int peak_kb;
  char name [256];
  uint local_11c;
  char local_118 [256];
  
  uVar1 = getpid();
  sprintf(local_118,"/proc/%d/status",(ulong)uVar1);
  __stream = fopen(local_118,"rb");
  uVar1 = 0;
  if (__stream != (FILE *)0x0) {
    local_11c = 0;
    iVar2 = feof(__stream);
    if (iVar2 == 0) {
      do {
        iVar2 = __isoc99_fscanf(__stream,"VmPeak: %d kB",&local_11c);
        if (iVar2 == 1) break;
        do {
          iVar2 = feof(__stream);
          if (iVar2 != 0) break;
          iVar2 = fgetc(__stream);
        } while (iVar2 != 10);
        iVar2 = feof(__stream);
      } while (iVar2 == 0);
    }
    fclose(__stream);
    uVar1 = local_11c;
  }
  if (uVar1 + 0x3ff < 0x7ff) {
    dVar4 = memUsed();
  }
  else {
    uVar3 = uVar1 + 0x3ff;
    if (-1 < (int)uVar1) {
      uVar3 = uVar1;
    }
    dVar4 = (double)((int)uVar3 >> 10);
  }
  return dVar4;
}

Assistant:

static inline int memReadPeak(void)
{
    char  name[256];
    pid_t pid = getpid();

    sprintf(name, "/proc/%d/status", pid);
    FILE* in = fopen(name, "rb");
    if (in == NULL) return 0;

    // Find the correct line, beginning with "VmPeak:":
    int peak_kb = 0;
    while (!feof(in) && fscanf(in, "VmPeak: %d kB", &peak_kb) != 1)
        while (!feof(in) && fgetc(in) != '\n')
            ;
    fclose(in);

    return peak_kb;
}